

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O2

void __thiscall IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CSeqStatement *statement)

{
  CStatement *pCVar1;
  CStatement *pCVar2;
  CSeqStatement *this_00;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_30;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_28;
  
  pCVar1 = CSeqStatement::LeftStatement(statement);
  (**(pCVar1->super_IStatement).super_INode._vptr_INode)(pCVar1,this);
  pCVar1 = (this->childStatement)._M_t.
           super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
           .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
  (this->childStatement)._M_t.
  super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
  super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)0x0;
  pCVar2 = CSeqStatement::RightStatement(statement);
  (**(pCVar2->super_IStatement).super_INode._vptr_INode)(pCVar2,this);
  pCVar2 = (this->childStatement)._M_t.
           super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
           .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
  (this->childStatement)._M_t.
  super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
  super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)0x0;
  this_00 = (CSeqStatement *)operator_new(0x18);
  local_30._M_head_impl = pCVar2;
  local_28._M_head_impl = pCVar1;
  CSeqStatement::CSeqStatement
            (this_00,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                      *)&local_28,
             (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             &local_30);
  pCVar1 = (this->childStatement)._M_t.
           super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
           .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
  (this->childStatement)._M_t.
  super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
  super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)this_00;
  if (pCVar1 != (CStatement *)0x0) {
    (**(code **)((long)(pCVar1->super_IStatement).super_INode + 0x10))();
  }
  if (local_30._M_head_impl != (CStatement *)0x0) {
    (*((local_30._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  local_30._M_head_impl = (CStatement *)0x0;
  if (local_28._M_head_impl != (CStatement *)0x0) {
    (*((local_28._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CSeqStatement &statement) {
    statement.LeftStatement()->Accept(*this);
    std::unique_ptr<const CStatement> left = std::move(childStatement);

    statement.RightStatement()->Accept(*this);
    std::unique_ptr<const CStatement> right = std::move(childStatement);

    childStatement = SMOVE_UNIQ(new CSeqStatement(
            std::move(left),
            std::move(right)
    ));
}